

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

int stb_perfect_hash(stb_perfect *p,uint x)

{
  uint uVar1;
  uint uVar2;
  
  if (p->table != (stb_uint32 *)0x0) {
    uVar1 = p->multiplicand * x;
    uVar2 = (uVar1 >> 0x18) + (x >> 0x10) & p->b_mask;
    if (p->large_bmap == (stb_uint16 *)0x0) {
      uVar2 = (uint)p->small_bmap[uVar2];
    }
    else {
      uVar2 = (uint)p->large_bmap[uVar2];
    }
    uVar2 = uVar2 ^ uVar1 + (x >> 0x10) >> 0xc & p->table_mask;
    uVar1 = 0xffffffff;
    if (p->table[uVar2] == x) {
      uVar1 = uVar2;
    }
    return uVar1;
  }
  return -1;
}

Assistant:

int stb_perfect_hash(stb_perfect *p, unsigned int x)
{
   stb_uint m = x * p->multiplicand;
   stb_uint y = x >> 16;
   stb_uint bv = (m >> 24) + y;
   stb_uint av = (m + y) >> 12;
   if (p->table == NULL) return -1;  // uninitialized table fails
   bv &= p->b_mask;
   av &= p->table_mask;
   if (p->large_bmap)
      av ^= p->large_bmap[bv];
   else
      av ^= p->small_bmap[bv];
   return p->table[av] == x ? av : -1;
}